

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar7;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar8;
  undefined8 *puVar9;
  value_type vVar10;
  double dVar11;
  double dVar12;
  
  vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
           ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar11 = cos(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar5 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar6 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar1 = pFVar6->val_;
  dVar2 = pFVar5->val_;
  dVar3 = (pFVar6->dx_).ptr_to_data[i];
  dVar4 = (pFVar5->dx_).ptr_to_data[i];
  dVar12 = sin(dVar1 * dVar2);
  pFVar7 = (this->left_->fadexpr_).left_;
  pFVar8 = (pFVar7->fadexpr_).left_;
  puVar9 = (undefined8 *)(pFVar8->fadexpr_).left_;
  return dVar11 * vVar10 -
         *(double *)*puVar9 * *(double *)puVar9[1] * ((pFVar8->fadexpr_).right_)->val_ *
         ((pFVar7->fadexpr_).right_)->val_ * ((this->left_->fadexpr_).right_)->val_ *
         dVar12 * (dVar4 * dVar1 + dVar3 * dVar2);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}